

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# move_constants.cpp
# Opt level: O0

void __thiscall
duckdb::MoveConstantsRule::MoveConstantsRule(MoveConstantsRule *this,ExpressionRewriter *rewriter)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  pointer pCVar1;
  pointer pFVar2;
  undefined8 *in_RDI;
  templated_unique_single_t child_expression_matcher;
  templated_unique_single_t child_constant_matcher;
  templated_unique_single_t arithmetic;
  templated_unique_single_t op;
  ExpressionRewriter *in_stack_fffffffffffffd78;
  unique_ptr<duckdb::ComparisonExpressionMatcher,_std::default_delete<duckdb::ComparisonExpressionMatcher>_>
  *__x;
  Rule *in_stack_fffffffffffffd80;
  key_equal *in_stack_fffffffffffffd88;
  hasher *in_stack_fffffffffffffd90;
  size_type in_stack_fffffffffffffd98;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffda0;
  iterator in_stack_fffffffffffffda8;
  size_type in_stack_fffffffffffffdb0;
  allocator_type *in_stack_fffffffffffffdc0;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffde8;
  string *local_1d0;
  undefined1 local_107 [15];
  string local_f8 [32];
  string local_d8 [32];
  string local_b8 [32];
  string *local_98;
  undefined8 local_90;
  
  Rule::Rule(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
  *in_RDI = &PTR__MoveConstantsRule_035146e0;
  make_uniq<duckdb::ComparisonExpressionMatcher>();
  unique_ptr<duckdb::ComparisonExpressionMatcher,_std::default_delete<duckdb::ComparisonExpressionMatcher>,_true>
  ::operator->((unique_ptr<duckdb::ComparisonExpressionMatcher,_std::default_delete<duckdb::ComparisonExpressionMatcher>,_true>
                *)in_stack_fffffffffffffd80);
  make_uniq<duckdb::ConstantExpressionMatcher>();
  unique_ptr<duckdb::ExpressionMatcher,std::default_delete<duckdb::ExpressionMatcher>,true>::
  unique_ptr<duckdb::ConstantExpressionMatcher,std::default_delete<std::unique_ptr<duckdb::ExpressionMatcher,std::default_delete<duckdb::ExpressionMatcher>>>,void>
            ((unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>,_true>
              *)in_stack_fffffffffffffd80,
             (unique_ptr<duckdb::ConstantExpressionMatcher,_std::default_delete<duckdb::ConstantExpressionMatcher>_>
              *)in_stack_fffffffffffffd78);
  ::std::
  vector<duckdb::unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>,_true>_>_>
  ::push_back((vector<duckdb::unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>,_true>_>_>
               *)in_stack_fffffffffffffd80,(value_type *)in_stack_fffffffffffffd78);
  unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>,_true>::
  ~unique_ptr((unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>,_true>
               *)0xce1134);
  unique_ptr<duckdb::ConstantExpressionMatcher,_std::default_delete<duckdb::ConstantExpressionMatcher>,_true>
  ::~unique_ptr((unique_ptr<duckdb::ConstantExpressionMatcher,_std::default_delete<duckdb::ConstantExpressionMatcher>,_true>
                 *)0xce1141);
  pCVar1 = unique_ptr<duckdb::ComparisonExpressionMatcher,_std::default_delete<duckdb::ComparisonExpressionMatcher>,_true>
           ::operator->((unique_ptr<duckdb::ComparisonExpressionMatcher,_std::default_delete<duckdb::ComparisonExpressionMatcher>,_true>
                         *)in_stack_fffffffffffffd80);
  pCVar1->policy = UNORDERED;
  make_uniq<duckdb::FunctionExpressionMatcher>();
  local_107[3] = 1;
  local_107._7_8_ = local_f8;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_f8,"+",(allocator *)(local_107 + 6));
  local_107._7_8_ = local_d8;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_d8,"-",(allocator *)(local_107 + 5));
  local_107._7_8_ = local_b8;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_b8,anon_var_dwarf_3eb663c + 8,(allocator *)(local_107 + 4));
  local_107[3] = 0;
  local_98 = local_f8;
  local_90 = 3;
  __x = (unique_ptr<duckdb::ComparisonExpressionMatcher,_std::default_delete<duckdb::ComparisonExpressionMatcher>_>
         *)local_107;
  ::std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)0xce1298);
  __l._M_len = in_stack_fffffffffffffdb0;
  __l._M_array = in_stack_fffffffffffffda8;
  ::std::
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::unordered_set(in_stack_fffffffffffffda0,__l,in_stack_fffffffffffffd98,in_stack_fffffffffffffd90,
                  in_stack_fffffffffffffd88,in_stack_fffffffffffffdc0);
  make_uniq<duckdb::ManyFunctionMatcher,std::unordered_set<std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>
            (in_stack_fffffffffffffde8);
  unique_ptr<duckdb::FunctionMatcher,std::default_delete<duckdb::FunctionMatcher>,true>::
  unique_ptr<duckdb::ManyFunctionMatcher,std::default_delete<std::unique_ptr<duckdb::FunctionMatcher,std::default_delete<duckdb::FunctionMatcher>>>,void>
            ((unique_ptr<duckdb::FunctionMatcher,_std::default_delete<duckdb::FunctionMatcher>,_true>
              *)in_stack_fffffffffffffd80,
             (unique_ptr<duckdb::ManyFunctionMatcher,_std::default_delete<duckdb::ManyFunctionMatcher>_>
              *)__x);
  unique_ptr<duckdb::FunctionExpressionMatcher,_std::default_delete<duckdb::FunctionExpressionMatcher>,_true>
  ::operator->((unique_ptr<duckdb::FunctionExpressionMatcher,_std::default_delete<duckdb::FunctionExpressionMatcher>,_true>
                *)in_stack_fffffffffffffd80);
  unique_ptr<duckdb::FunctionMatcher,_std::default_delete<duckdb::FunctionMatcher>,_true>::operator=
            ((unique_ptr<duckdb::FunctionMatcher,_std::default_delete<duckdb::FunctionMatcher>,_true>
              *)in_stack_fffffffffffffd80,
             (unique_ptr<duckdb::FunctionMatcher,_std::default_delete<duckdb::FunctionMatcher>,_true>
              *)__x);
  unique_ptr<duckdb::FunctionMatcher,_std::default_delete<duckdb::FunctionMatcher>,_true>::
  ~unique_ptr((unique_ptr<duckdb::FunctionMatcher,_std::default_delete<duckdb::FunctionMatcher>,_true>
               *)0xce1342);
  unique_ptr<duckdb::ManyFunctionMatcher,_std::default_delete<duckdb::ManyFunctionMatcher>,_true>::
  ~unique_ptr((unique_ptr<duckdb::ManyFunctionMatcher,_std::default_delete<duckdb::ManyFunctionMatcher>,_true>
               *)0xce134f);
  ::std::
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unordered_set((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)0xce135c);
  ::std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)0xce1369);
  local_1d0 = (string *)&local_98;
  do {
    local_1d0 = local_1d0 + -0x20;
    ::std::__cxx11::string::~string(local_1d0);
  } while (local_1d0 != local_f8);
  ::std::allocator<char>::~allocator((allocator<char> *)(local_107 + 4));
  ::std::allocator<char>::~allocator((allocator<char> *)(local_107 + 5));
  ::std::allocator<char>::~allocator((allocator<char> *)(local_107 + 6));
  make_uniq<duckdb::IntegerTypeMatcher>();
  unique_ptr<duckdb::TypeMatcher,std::default_delete<duckdb::TypeMatcher>,true>::
  unique_ptr<duckdb::IntegerTypeMatcher,std::default_delete<std::unique_ptr<duckdb::TypeMatcher,std::default_delete<duckdb::TypeMatcher>>>,void>
            ((unique_ptr<duckdb::TypeMatcher,_std::default_delete<duckdb::TypeMatcher>,_true> *)
             in_stack_fffffffffffffd80,
             (unique_ptr<duckdb::IntegerTypeMatcher,_std::default_delete<duckdb::IntegerTypeMatcher>_>
              *)__x);
  unique_ptr<duckdb::FunctionExpressionMatcher,_std::default_delete<duckdb::FunctionExpressionMatcher>,_true>
  ::operator->((unique_ptr<duckdb::FunctionExpressionMatcher,_std::default_delete<duckdb::FunctionExpressionMatcher>,_true>
                *)in_stack_fffffffffffffd80);
  unique_ptr<duckdb::TypeMatcher,_std::default_delete<duckdb::TypeMatcher>,_true>::operator=
            ((unique_ptr<duckdb::TypeMatcher,_std::default_delete<duckdb::TypeMatcher>,_true> *)
             in_stack_fffffffffffffd80,
             (unique_ptr<duckdb::TypeMatcher,_std::default_delete<duckdb::TypeMatcher>,_true> *)__x)
  ;
  unique_ptr<duckdb::TypeMatcher,_std::default_delete<duckdb::TypeMatcher>,_true>::~unique_ptr
            ((unique_ptr<duckdb::TypeMatcher,_std::default_delete<duckdb::TypeMatcher>,_true> *)
             0xce144b);
  unique_ptr<duckdb::IntegerTypeMatcher,_std::default_delete<duckdb::IntegerTypeMatcher>,_true>::
  ~unique_ptr((unique_ptr<duckdb::IntegerTypeMatcher,_std::default_delete<duckdb::IntegerTypeMatcher>,_true>
               *)0xce1458);
  make_uniq<duckdb::ConstantExpressionMatcher>();
  make_uniq<duckdb::ExpressionMatcher>();
  make_uniq<duckdb::IntegerTypeMatcher>();
  unique_ptr<duckdb::TypeMatcher,std::default_delete<duckdb::TypeMatcher>,true>::
  unique_ptr<duckdb::IntegerTypeMatcher,std::default_delete<std::unique_ptr<duckdb::TypeMatcher,std::default_delete<duckdb::TypeMatcher>>>,void>
            ((unique_ptr<duckdb::TypeMatcher,_std::default_delete<duckdb::TypeMatcher>,_true> *)
             in_stack_fffffffffffffd80,
             (unique_ptr<duckdb::IntegerTypeMatcher,_std::default_delete<duckdb::IntegerTypeMatcher>_>
              *)__x);
  unique_ptr<duckdb::ConstantExpressionMatcher,_std::default_delete<duckdb::ConstantExpressionMatcher>,_true>
  ::operator->((unique_ptr<duckdb::ConstantExpressionMatcher,_std::default_delete<duckdb::ConstantExpressionMatcher>,_true>
                *)in_stack_fffffffffffffd80);
  unique_ptr<duckdb::TypeMatcher,_std::default_delete<duckdb::TypeMatcher>,_true>::operator=
            ((unique_ptr<duckdb::TypeMatcher,_std::default_delete<duckdb::TypeMatcher>,_true> *)
             in_stack_fffffffffffffd80,
             (unique_ptr<duckdb::TypeMatcher,_std::default_delete<duckdb::TypeMatcher>,_true> *)__x)
  ;
  unique_ptr<duckdb::TypeMatcher,_std::default_delete<duckdb::TypeMatcher>,_true>::~unique_ptr
            ((unique_ptr<duckdb::TypeMatcher,_std::default_delete<duckdb::TypeMatcher>,_true> *)
             0xce14df);
  unique_ptr<duckdb::IntegerTypeMatcher,_std::default_delete<duckdb::IntegerTypeMatcher>,_true>::
  ~unique_ptr((unique_ptr<duckdb::IntegerTypeMatcher,_std::default_delete<duckdb::IntegerTypeMatcher>,_true>
               *)0xce14ec);
  make_uniq<duckdb::IntegerTypeMatcher>();
  unique_ptr<duckdb::TypeMatcher,std::default_delete<duckdb::TypeMatcher>,true>::
  unique_ptr<duckdb::IntegerTypeMatcher,std::default_delete<std::unique_ptr<duckdb::TypeMatcher,std::default_delete<duckdb::TypeMatcher>>>,void>
            ((unique_ptr<duckdb::TypeMatcher,_std::default_delete<duckdb::TypeMatcher>,_true> *)
             in_stack_fffffffffffffd80,
             (unique_ptr<duckdb::IntegerTypeMatcher,_std::default_delete<duckdb::IntegerTypeMatcher>_>
              *)__x);
  unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>,_true>::
  operator->((unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>,_true>
              *)in_stack_fffffffffffffd80);
  unique_ptr<duckdb::TypeMatcher,_std::default_delete<duckdb::TypeMatcher>,_true>::operator=
            ((unique_ptr<duckdb::TypeMatcher,_std::default_delete<duckdb::TypeMatcher>,_true> *)
             in_stack_fffffffffffffd80,
             (unique_ptr<duckdb::TypeMatcher,_std::default_delete<duckdb::TypeMatcher>,_true> *)__x)
  ;
  unique_ptr<duckdb::TypeMatcher,_std::default_delete<duckdb::TypeMatcher>,_true>::~unique_ptr
            ((unique_ptr<duckdb::TypeMatcher,_std::default_delete<duckdb::TypeMatcher>,_true> *)
             0xce154f);
  unique_ptr<duckdb::IntegerTypeMatcher,_std::default_delete<duckdb::IntegerTypeMatcher>,_true>::
  ~unique_ptr((unique_ptr<duckdb::IntegerTypeMatcher,_std::default_delete<duckdb::IntegerTypeMatcher>,_true>
               *)0xce155c);
  unique_ptr<duckdb::FunctionExpressionMatcher,_std::default_delete<duckdb::FunctionExpressionMatcher>,_true>
  ::operator->((unique_ptr<duckdb::FunctionExpressionMatcher,_std::default_delete<duckdb::FunctionExpressionMatcher>,_true>
                *)in_stack_fffffffffffffd80);
  unique_ptr<duckdb::ExpressionMatcher,std::default_delete<duckdb::ExpressionMatcher>,true>::
  unique_ptr<duckdb::ConstantExpressionMatcher,std::default_delete<std::unique_ptr<duckdb::ExpressionMatcher,std::default_delete<duckdb::ExpressionMatcher>>>,void>
            ((unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>,_true>
              *)in_stack_fffffffffffffd80,
             (unique_ptr<duckdb::ConstantExpressionMatcher,_std::default_delete<duckdb::ConstantExpressionMatcher>_>
              *)__x);
  ::std::
  vector<duckdb::unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>,_true>_>_>
  ::push_back((vector<duckdb::unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>,_true>_>_>
               *)in_stack_fffffffffffffd80,(value_type *)__x);
  unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>,_true>::
  ~unique_ptr((unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>,_true>
               *)0xce15b6);
  unique_ptr<duckdb::FunctionExpressionMatcher,_std::default_delete<duckdb::FunctionExpressionMatcher>,_true>
  ::operator->((unique_ptr<duckdb::FunctionExpressionMatcher,_std::default_delete<duckdb::FunctionExpressionMatcher>,_true>
                *)in_stack_fffffffffffffd80);
  ::std::
  vector<duckdb::unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>,_true>_>_>
  ::push_back((vector<duckdb::unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>,_true>_>_>
               *)in_stack_fffffffffffffd80,(value_type *)__x);
  pFVar2 = unique_ptr<duckdb::FunctionExpressionMatcher,_std::default_delete<duckdb::FunctionExpressionMatcher>,_true>
           ::operator->((unique_ptr<duckdb::FunctionExpressionMatcher,_std::default_delete<duckdb::FunctionExpressionMatcher>,_true>
                         *)in_stack_fffffffffffffd80);
  pFVar2->policy = SOME;
  unique_ptr<duckdb::ComparisonExpressionMatcher,_std::default_delete<duckdb::ComparisonExpressionMatcher>,_true>
  ::operator->((unique_ptr<duckdb::ComparisonExpressionMatcher,_std::default_delete<duckdb::ComparisonExpressionMatcher>,_true>
                *)in_stack_fffffffffffffd80);
  unique_ptr<duckdb::ExpressionMatcher,std::default_delete<duckdb::ExpressionMatcher>,true>::
  unique_ptr<duckdb::FunctionExpressionMatcher,std::default_delete<std::unique_ptr<duckdb::ExpressionMatcher,std::default_delete<duckdb::ExpressionMatcher>>>,void>
            ((unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>,_true>
              *)in_stack_fffffffffffffd80,
             (unique_ptr<duckdb::FunctionExpressionMatcher,_std::default_delete<duckdb::FunctionExpressionMatcher>_>
              *)__x);
  ::std::
  vector<duckdb::unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>,_true>_>_>
  ::push_back((vector<duckdb::unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>,_true>_>_>
               *)in_stack_fffffffffffffd80,(value_type *)__x);
  unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>,_true>::
  ~unique_ptr((unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>,_true>
               *)0xce165c);
  unique_ptr<duckdb::ExpressionMatcher,std::default_delete<duckdb::ExpressionMatcher>,true>::
  unique_ptr<duckdb::ComparisonExpressionMatcher,std::default_delete<std::unique_ptr<duckdb::ExpressionMatcher,std::default_delete<duckdb::ExpressionMatcher>>>,void>
            ((unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>,_true>
              *)in_stack_fffffffffffffd80,__x);
  unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>,_true>::
  operator=((unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>,_true>
             *)in_stack_fffffffffffffd80,
            (unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>,_true>
             *)__x);
  unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>,_true>::
  ~unique_ptr((unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>,_true>
               *)0xce1697);
  unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>,_true>::
  ~unique_ptr((unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>,_true>
               *)0xce16a4);
  unique_ptr<duckdb::ConstantExpressionMatcher,_std::default_delete<duckdb::ConstantExpressionMatcher>,_true>
  ::~unique_ptr((unique_ptr<duckdb::ConstantExpressionMatcher,_std::default_delete<duckdb::ConstantExpressionMatcher>,_true>
                 *)0xce16b1);
  unique_ptr<duckdb::FunctionExpressionMatcher,_std::default_delete<duckdb::FunctionExpressionMatcher>,_true>
  ::~unique_ptr((unique_ptr<duckdb::FunctionExpressionMatcher,_std::default_delete<duckdb::FunctionExpressionMatcher>,_true>
                 *)0xce16be);
  unique_ptr<duckdb::ComparisonExpressionMatcher,_std::default_delete<duckdb::ComparisonExpressionMatcher>,_true>
  ::~unique_ptr((unique_ptr<duckdb::ComparisonExpressionMatcher,_std::default_delete<duckdb::ComparisonExpressionMatcher>,_true>
                 *)0xce16cb);
  return;
}

Assistant:

MoveConstantsRule::MoveConstantsRule(ExpressionRewriter &rewriter) : Rule(rewriter) {
	auto op = make_uniq<ComparisonExpressionMatcher>();
	op->matchers.push_back(make_uniq<ConstantExpressionMatcher>());
	op->policy = SetMatcher::Policy::UNORDERED;

	auto arithmetic = make_uniq<FunctionExpressionMatcher>();
	// we handle multiplication, addition and subtraction because those are "easy"
	// integer division makes the division case difficult
	// e.g. [x / 2 = 3] means [x = 6 OR x = 7] because of truncation -> no clean rewrite rules
	arithmetic->function = make_uniq<ManyFunctionMatcher>(unordered_set<string> {"+", "-", "*"});
	// we match only on integral numeric types
	arithmetic->type = make_uniq<IntegerTypeMatcher>();
	auto child_constant_matcher = make_uniq<ConstantExpressionMatcher>();
	auto child_expression_matcher = make_uniq<ExpressionMatcher>();
	child_constant_matcher->type = make_uniq<IntegerTypeMatcher>();
	child_expression_matcher->type = make_uniq<IntegerTypeMatcher>();
	arithmetic->matchers.push_back(std::move(child_constant_matcher));
	arithmetic->matchers.push_back(std::move(child_expression_matcher));
	arithmetic->policy = SetMatcher::Policy::SOME;
	op->matchers.push_back(std::move(arithmetic));
	root = std::move(op);
}